

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SymmetricOuterEdgeCase::iterate
          (SymmetricOuterEdgeCase *this)

{
  ostringstream *poVar1;
  RenderContext *pRVar2;
  undefined8 uVar3;
  OuterEdgeDescription *pOVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  deUint32 dVar8;
  int iVar9;
  GLenum err;
  TessPrimitiveType TVar10;
  undefined4 extraout_var;
  long lVar11;
  undefined4 extraout_var_01;
  MessageBuilder *this_00;
  Functions *gl;
  void *pvVar12;
  char *__rhs;
  long lVar13;
  TestError *this_01;
  pointer pfVar14;
  Functional *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  Vector<bool,_2> *cond;
  long lVar15;
  int constantOuterLevelIndex;
  undefined8 extraout_RDX;
  undefined8 uVar16;
  Vector<float,_3> *extraout_RDX_00;
  Vector<float,_3> *extraout_RDX_01;
  Vector<float,_3> *extraout_RDX_02;
  Vector<float,_3> *key;
  Vector<float,_3> *key_00;
  undefined8 extraout_RDX_03;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  Vec3Set *this_04;
  float *outerLevels;
  pointer *ppfVar20;
  Functional *pFVar21;
  float constantOuterLevel;
  int numBytes;
  float local_560;
  float local_55c;
  OuterEdgeDescription *local_558;
  Result tfResult;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  undefined1 local_508 [8];
  float local_500;
  TestLog *local_4e8;
  Vector<bool,_2> result;
  Vec3 endpointB;
  Vec3Set nonMirroredEdgeVertices;
  vector<float,_std::allocator<float>_> patchTessLevels_1;
  Vec3Set mirroredEdgeVertices;
  RandomViewport viewport;
  vector<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
  edgeDescriptions;
  TFHandler tfHandler;
  vector<float,_std::allocator<float>_> patchTessLevels;
  undefined1 local_208 [8];
  ostream local_200;
  VertexArrayBinding bindings [1];
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  local_4e8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (*pRVar2->_vptr_RenderContext[4])(pRVar2);
  dVar8 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar7),0x10,0x10,dVar8);
  iVar7 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  lVar11 = CONCAT44(extraout_var_00,iVar7);
  outerEdgeDescriptions(&edgeDescriptions,this->m_primitiveType);
  constantOuterLevel = arrayMax<float,12>(&iterate::singleOuterEdgeLevels);
  generatePatchTessLevels(&patchTessLevels,0,constantOuterLevelIndex,constantOuterLevel);
  iVar7 = referenceVertexCount
                    (this->m_primitiveType,this->m_spacing,this->m_usePointMode,
                     patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + 2);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&patchTessLevels.super__Vector_base<float,_std::allocator<float>_>);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  tfHandler.m_renderCtx = pRVar2;
  glu::TypedObjectWrapper<(glu::ObjectType)4>::TypedObjectWrapper(&tfHandler.m_tf,pRVar2);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper(&tfHandler.m_tfBuffer,pRVar2);
  glu::TypedObjectWrapper<(glu::ObjectType)6>::TypedObjectWrapper(&tfHandler.m_tfPrimQuery,pRVar2);
  iVar9 = (*(tfHandler.m_renderCtx)->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar9) + 0x40))
            (0x8c8e,tfHandler.m_tfBuffer.super_ObjectWrapper.m_object);
  (**(code **)(CONCAT44(extraout_var_01,iVar9) + 0x150))
            (0x8c8e,(long)(iVar7 * 0x10 + 0x30),0,0x88e9);
  (**(code **)(lVar11 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar11 + 0xfd8))(0x8e72);
  lVar19 = 0;
  uVar16 = extraout_RDX;
  do {
    if ((int)((ulong)((long)edgeDescriptions.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)edgeDescriptions.
                           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) <= lVar19) {
      TransformFeedbackHandler<tcu::Vector<float,_4>_>::~TransformFeedbackHandler(&tfHandler);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
LAB_0121d8d2:
      std::
      _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
      ::~_Vector_base(&edgeDescriptions.
                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                     );
      return STOP;
    }
    local_558 = edgeDescriptions.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar19;
    lVar15 = 0;
    while (ppfVar20 = &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish, lVar15 != 0xc) {
      generatePatchTessLevels
                (&patchTessLevels_1,(int)lVar19,(int)uVar16,iterate::singleOuterEdgeLevels[lVar15]);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&patchTessLevels,"in_v_attr",(allocator<char> *)local_208);
      glu::va::Float(bindings,(string *)&patchTessLevels,1,
                     (int)((ulong)((long)patchTessLevels_1.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)patchTessLevels_1.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2),0,
                     patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
      std::__cxx11::string::~string((string *)&patchTessLevels);
      patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_4e8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppfVar20);
      std::operator<<((ostream *)ppfVar20,"Testing with outer tessellation level ");
      this_00 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&patchTessLevels,
                           iterate::singleOuterEdgeLevels + lVar15);
      poVar1 = &this_00->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," for the ");
      Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                ((string *)local_208,local_558);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      (string *)local_208);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      " edge, and with various levels for other edges");
      tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppfVar20);
      dVar8 = (((this->m_program).m_ptr)->m_program).m_program;
      (**(code **)(lVar11 + 0x1680))(dVar8);
      uVar17 = 0;
      if (this->m_usePointMode == false) {
        uVar17 = 0xffffffff;
        if ((ulong)this->m_primitiveType < 3) {
          uVar17 = *(uint *)(&DAT_01890e10 + (ulong)this->m_primitiveType * 4);
        }
      }
      uVar18 = (long)patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
      iVar7 = (*(tfHandler.m_renderCtx)->_vptr_RenderContext[3])();
      gl = (Functions *)CONCAT44(extraout_var_02,iVar7);
      (*gl->bindTransformFeedback)(0x8e22,tfHandler.m_tf.super_ObjectWrapper.m_object);
      (*gl->bindBuffer)(0x8c8e,tfHandler.m_tfBuffer.super_ObjectWrapper.m_object);
      (*gl->bindBufferBase)(0x8c8e,0,tfHandler.m_tfBuffer.super_ObjectWrapper.m_object);
      (*gl->beginQuery)(0x8c88,tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object);
      (*gl->beginTransformFeedback)(uVar17);
      patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT44((int)(uVar18 >> 2),7);
      patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(patchTessLevels.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_finish._4_4_,3);
      patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      glu::draw(tfHandler.m_renderCtx,dVar8,1,bindings,(PrimitiveList *)&patchTessLevels,
                (DrawUtilCallback *)0x0);
      err = (*gl->getError)();
      glu::checkError(err,"Draw failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                      ,0x15e);
      (*gl->endTransformFeedback)();
      (*gl->endQuery)(0x8c88);
      local_560 = (float)getQueryResult(gl,tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object);
      iVar7 = -1;
      if (uVar17 < 5) {
        iVar7 = *(int *)(&DAT_01890e1c + (ulong)uVar17 * 4);
      }
      uVar17 = iVar7 * (int)local_560;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &endpointB,(long)(int)uVar17,(allocator_type *)&patchTessLevels);
      uVar16 = endpointB.m_data._0_8_;
      numBytes = uVar17 * 0x10;
      pvVar12 = (*gl->mapBufferRange)(0x8c8e,0,(long)numBytes,1);
      local_55c = (float)(*gl->getError)();
      local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
      local_528._M_string_length = 0;
      local_528.field_2._M_local_buf[0] = '\0';
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508,
                     &local_528,"glMapBufferRange(");
      __rhs = glu::getBufferTargetName(0x8c8e);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &mirroredEdgeVertices,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_508,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &nonMirroredEdgeVertices,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &mirroredEdgeVertices,", 0, ");
      de::toString<int>((string *)&result,&numBytes);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &nonMirroredEdgeVertices,(string *)&result);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &patchTessLevels,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     ", GL_MAP_READ_BIT)");
      glu::checkError((deUint32)local_55c,
                      (char *)patchTessLevels.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                      ,0x10d);
      std::__cxx11::string::~string((string *)&patchTessLevels);
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::string::~string((string *)&result);
      std::__cxx11::string::~string((string *)&nonMirroredEdgeVertices);
      std::__cxx11::string::~string((string *)&mirroredEdgeVertices);
      std::__cxx11::string::~string((string *)local_508);
      std::__cxx11::string::~string((string *)&local_528);
      if (pvVar12 == (void *)0x0) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,"mappedData != DE_NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                   ,0x10e);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if ((int)uVar17 < 1) {
        uVar17 = 0;
      }
      for (lVar13 = 0; (ulong)uVar17 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
        uVar3 = ((undefined8 *)((long)pvVar12 + lVar13))[1];
        *(undefined8 *)(uVar16 + lVar13) = *(undefined8 *)((long)pvVar12 + lVar13);
        ((undefined8 *)(uVar16 + lVar13))[1] = uVar3;
      }
      (*gl->unmapBuffer)(0x8c8e);
      tfResult.numPrimitives = (int)local_560;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&tfResult.varying,
                 (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &endpointB);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                    &endpointB);
      outerLevels = patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + 2;
      pfVar14 = patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar17 = referenceVertexCount
                         (this->m_primitiveType,this->m_spacing,this->m_usePointMode,
                          patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start,outerLevels);
      iVar9 = (int)outerLevels;
      iVar7 = (int)pfVar14;
      if (uVar17 == (uint)((ulong)((long)tfResult.varying.
                                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)tfResult.varying.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        this_02 = (Functional *)0x0;
        nonMirroredEdgeVertices._M_t._M_impl._0_1_ = 0;
        nonMirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        nonMirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        nonMirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &nonMirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header;
        nonMirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        mirroredEdgeVertices._M_t._M_impl._0_1_ = 0;
        mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header;
        mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        pFVar21 = (Functional *)(ulong)uVar17;
        if ((int)uVar17 < 1) {
          pFVar21 = this_02;
        }
        lVar13 = 0;
        nonMirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             nonMirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             mirroredEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          iVar9 = (int)outerLevels;
          iVar7 = (int)this_02;
          if ((long)pFVar21 << 4 == lVar13) break;
          patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               *(pointer *)
                ((long)(tfResult.varying.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar13);
          patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(patchTessLevels.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 *(undefined4 *)
                                  ((long)(tfResult.varying.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                  lVar13 + 8));
          bVar5 = OuterEdgeDescription::contains(local_558,(Vec3 *)&patchTessLevels);
          if (bVar5) {
            TVar10 = this->m_primitiveType;
            if (TVar10 == TESSPRIMITIVETYPE_TRIANGLES) {
              tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_508,0.0);
              tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&local_528,0.5);
              this_02 = (Functional *)&result;
              singleTrueMask<3>(this_02,local_558->constantCoordinateIndex);
              tcu::select<float,3>
                        ((tcu *)local_208,(Vector<float,_3> *)local_508,
                         (Vector<float,_3> *)&local_528,(Vector<bool,_3> *)this_02);
              bVar5 = tcu::Vector<float,_3>::operator==
                                ((Vector<float,_3> *)&patchTessLevels,(Vector<float,_3> *)local_208)
              ;
              if (bVar5) goto LAB_0121d23e;
              TVar10 = this->m_primitiveType;
            }
            if (TVar10 == TESSPRIMITIVETYPE_QUADS) {
              local_560 = patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_;
              local_55c = patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_;
              local_508._4_4_ = local_558->constantCoordinateValueChoices[0];
              local_508._0_4_ = local_558->constantCoordinateValueChoices[0];
              local_528._M_dataplus._M_p = &DAT_3f0000003f000000;
              _result = _result & 0xffffffffffff0000;
              result.m_data[local_558->constantCoordinateIndex] = true;
              this_02 = (Functional *)&result;
              tcu::select<float,2>
                        ((tcu *)local_208,(Vector<float,_2> *)local_508,
                         (Vector<float,_2> *)&local_528,(Vector<bool,_2> *)this_02);
              if ((local_560 == (float)local_208._0_4_) &&
                 (!NAN(local_560) && !NAN((float)local_208._0_4_))) {
                if ((local_55c == (float)local_208._4_4_) &&
                   (!NAN(local_55c) && !NAN((float)local_208._4_4_))) goto LAB_0121d23e;
              }
              TVar10 = this->m_primitiveType;
            }
            if (TVar10 == TESSPRIMITIVETYPE_ISOLINES) {
              local_208 = (undefined1  [8])0x3f00000000000000;
              local_200._vptr_basic_ostream._0_4_ = 0.0;
              bVar5 = tcu::Vector<float,_3>::operator==
                                ((Vector<float,_3> *)&patchTessLevels,(Vector<float,_3> *)local_208)
              ;
              if (!bVar5) {
                local_508 = (undefined1  [8])0x3f0000003f800000;
                local_500 = 0.0;
                bVar5 = tcu::Vector<float,_3>::operator==
                                  ((Vector<float,_3> *)&patchTessLevels,
                                   (Vector<float,_3> *)local_508);
                if (!bVar5) {
                  local_528._M_dataplus._M_p = (pointer)0x0;
                  local_528._M_string_length = local_528._M_string_length & 0xffffffff00000000;
                  bVar5 = tcu::Vector<float,_3>::operator==
                                    ((Vector<float,_3> *)&patchTessLevels,
                                     (Vector<float,_3> *)&local_528);
                  if (!bVar5) {
                    _result = (pointer)0x3f800000;
                    bVar5 = tcu::Vector<float,_3>::operator==
                                      ((Vector<float,_3> *)&patchTessLevels,
                                       (Vector<float,_3> *)&result);
                    if (!bVar5) goto LAB_0121d20b;
                  }
                }
              }
            }
            else {
LAB_0121d20b:
              this_04 = &nonMirroredEdgeVertices;
              if (0.5 < *(float *)((long)(tfResult.varying.
                                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                  lVar13 + 0xc)) {
                this_04 = &mirroredEdgeVertices;
              }
              std::
              set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
              ::insert(this_04,(value_type *)&patchTessLevels);
            }
          }
LAB_0121d23e:
          lVar13 = lVar13 + 0x10;
        }
        if (this->m_primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
LAB_0121d393:
          bVar6 = std::operator!=(&nonMirroredEdgeVertices,&mirroredEdgeVertices);
          ppfVar20 = &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          bVar5 = true;
          if (bVar6) {
            local_208 = (undefined1  [8])local_4e8;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_200);
            std::operator<<(&local_200,
                            "Failure: the set of mirrored edges isn\'t equal to the set of non-mirrored edges (ignoring endpoints and possible middle)"
                           );
            patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)local_208,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)ppfVar20);
            std::operator<<((ostream *)ppfVar20,"Note: non-mirrored vertices:\n");
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      ((string *)local_508,(Functional *)&nonMirroredEdgeVertices,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,iVar7,iVar9);
            std::operator<<((ostream *)ppfVar20,(string *)local_508);
            std::operator<<((ostream *)ppfVar20,"\nmirrored vertices:\n");
            containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                      (&local_528,(Functional *)&mirroredEdgeVertices,
                       (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        *)0x0,iVar7,iVar9);
            std::operator<<((ostream *)ppfVar20,(string *)&local_528);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&patchTessLevels,
                       (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_528);
            std::__cxx11::string::~string((string *)local_508);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppfVar20);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_200);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Invalid set of vertices");
            goto LAB_0121d850;
          }
        }
        else {
          tcu::Vector<float,_3>::Vector((Vector<float,_3> *)&result);
          tcu::Vector<float,_3>::Vector(&endpointB);
          pOVar4 = local_558;
          if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
            local_508._4_4_ = local_558->constantCoordinateValueChoices[0];
            local_508._0_4_ = local_558->constantCoordinateValueChoices[0];
            local_528._M_dataplus._M_p = (pointer)0x0;
            numBytes = numBytes & 0xffff0000;
            *(undefined1 *)((long)&numBytes + (long)local_558->constantCoordinateIndex) = 1;
            cond = (Vector<bool,_2> *)&numBytes;
            tcu::select<float,2>
                      ((tcu *)local_208,(Vector<float,_2> *)local_508,(Vector<float,_2> *)&local_528
                       ,cond);
            patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)&result;
            patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x100000000;
            tcu::VecAccess<float,_3,_2>::operator=
                      ((VecAccess<float,_3,_2> *)&patchTessLevels,(Vector<float,_2> *)local_208);
            local_508._4_4_ = pOVar4->constantCoordinateValueChoices[0];
            local_508._0_4_ = local_508._4_4_;
            local_528._M_dataplus._M_p = (pointer)0x3f8000003f800000;
            numBytes = numBytes & 0xffff0000;
            *(undefined1 *)((long)&numBytes + (long)pOVar4->constantCoordinateIndex) = 1;
            tcu::select<float,2>
                      ((tcu *)local_208,(Vector<float,_2> *)local_508,(Vector<float,_2> *)&local_528
                       ,cond);
            iVar7 = (int)cond;
            patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start = endpointB.m_data;
            patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x100000000;
            tcu::VecAccess<float,_3,_2>::operator=
                      ((VecAccess<float,_3,_2> *)&patchTessLevels,(Vector<float,_2> *)local_208);
            key = extraout_RDX_02;
          }
          else {
            key = extraout_RDX_00;
            if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
              tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_208,1.0);
              tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_508,0.0);
              pOVar4 = local_558;
              this_03 = &local_528;
              singleTrueMask<3>((Functional *)this_03,(local_558->constantCoordinateIndex + 1) % 3);
              tcu::select<float,3>
                        ((tcu *)&patchTessLevels,(Vector<float,_3> *)local_208,
                         (Vector<float,_3> *)local_508,(Vector<bool,_3> *)this_03);
              _result = (pointer)patchTessLevels.super__Vector_base<float,_std::allocator<float>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
              tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_208,1.0);
              tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_508,0.0);
              singleTrueMask<3>((Functional *)this_03,(pOVar4->constantCoordinateIndex + 2) % 3);
              tcu::select<float,3>
                        ((tcu *)&patchTessLevels,(Vector<float,_3> *)local_208,
                         (Vector<float,_3> *)local_508,(Vector<bool,_3> *)this_03);
              iVar7 = (int)this_03;
              endpointB.m_data[2] =
                   patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish._0_4_;
              endpointB.m_data._0_8_ =
                   patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              key = extraout_RDX_01;
            }
          }
          ppfVar20 = &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          bVar5 = contains<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>,tcu::Vector<float,3>>
                            ((Functional *)&nonMirroredEdgeVertices,
                             (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)&result,key);
          if ((bVar5) &&
             (bVar5 = contains<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>,tcu::Vector<float,3>>
                                ((Functional *)&nonMirroredEdgeVertices,
                                 (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  *)&endpointB,key_00), bVar5)) {
            std::
            set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
            ::erase((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     *)&nonMirroredEdgeVertices,(key_type *)&result);
            std::
            set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
            ::erase((set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     *)&nonMirroredEdgeVertices,&endpointB);
            goto LAB_0121d393;
          }
          local_208 = (undefined1  [8])local_4e8;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_200);
          std::operator<<(&local_200,"Failure: edge doesn\'t contain both endpoints, ");
          tcu::operator<<(&local_200,(Vector<float,_3> *)&result);
          std::operator<<(&local_200," and ");
          tcu::operator<<(&local_200,&endpointB);
          patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_208,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppfVar20);
          std::operator<<((ostream *)ppfVar20,"Note: non-mirrored vertices:\n");
          containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                    ((string *)local_508,(Functional *)&nonMirroredEdgeVertices,
                     (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)0x0,iVar7,iVar9);
          std::operator<<((ostream *)ppfVar20,(string *)local_508);
          std::operator<<((ostream *)ppfVar20,"\nmirrored vertices:\n");
          containerStr<std::set<tcu::Vector<float,3>,deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                    (&local_528,(Functional *)&mirroredEdgeVertices,
                     (set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)0x0,iVar7,iVar9);
          std::operator<<((ostream *)ppfVar20,(string *)&local_528);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&patchTessLevels,(EndMessageToken *)&tcu::TestLog::EndMessage
                    );
          std::__cxx11::string::~string((string *)&local_528);
          std::__cxx11::string::~string((string *)local_508);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppfVar20);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_200);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Invalid set of vertices");
LAB_0121d850:
          bVar5 = false;
        }
        std::
        set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::~set(&mirroredEdgeVertices);
        std::
        set<tcu::Vector<float,_3>,_deqp::gles31::Functional::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::~set(&nonMirroredEdgeVertices);
      }
      else {
        local_208 = (undefined1  [8])local_4e8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_200);
        std::operator<<(&local_200,
                        "Failure: the number of vertices returned by transform feedback is ");
        std::ostream::_M_insert<unsigned_long>((ulong)&local_200);
        std::operator<<(&local_200,", expected ");
        std::ostream::operator<<(&local_200,uVar17);
        patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)local_208,
                                 (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        std::operator<<((ostream *)
                        &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                        "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
                       );
        containerStr<std::vector<float,std::allocator<float>>>
                  ((string *)&nonMirroredEdgeVertices,(Functional *)&patchTessLevels_1,
                   (vector<float,_std::allocator<float>_> *)0x6,iVar7,iVar9);
        std::operator<<((ostream *)
                        &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,(string *)&nonMirroredEdgeVertices);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&patchTessLevels,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&nonMirroredEdgeVertices);
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)
                   &patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_200);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid set of vertices");
        bVar5 = false;
      }
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&tfResult.varying.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::__cxx11::string::~string((string *)&bindings[0].binding.name);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&patchTessLevels_1.super__Vector_base<float,_std::allocator<float>_>);
      lVar15 = lVar15 + 1;
      uVar16 = extraout_RDX_03;
      if (!bVar5) {
        TransformFeedbackHandler<tcu::Vector<float,_4>_>::~TransformFeedbackHandler(&tfHandler);
        goto LAB_0121d8d2;
      }
    }
    lVar19 = lVar19 + 1;
  } while( true );
}

Assistant:

SymmetricOuterEdgeCase::IterateResult SymmetricOuterEdgeCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec4> TFHandler;

	TestLog&							log							= m_testCtx.getLog();
	const RenderContext&				renderCtx					= m_context.getRenderContext();
	const RandomViewport				viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const glw::Functions&				gl							= renderCtx.getFunctions();

	static const float					singleOuterEdgeLevels[]		= { 1.0f, 1.2f, 1.9f, 2.3f, 2.8f, 3.3f, 3.8f, 10.2f, 1.6f, 24.4f, 24.7f, 63.0f };
	const vector<OuterEdgeDescription>	edgeDescriptions			= outerEdgeDescriptions(m_primitiveType);

	{
		// Compute the number vertices in the largest draw call, so we can allocate the TF buffer just once.
		int maxNumVerticesInDrawCall;
		{
			const vector<float> patchTessLevels = generatePatchTessLevels(1, 0 /* outer-edge index doesn't affect vertex count */, arrayMax(singleOuterEdgeLevels));
			maxNumVerticesInDrawCall = referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);
		}

		{
			const TFHandler tfHandler(m_context.getRenderContext(), maxNumVerticesInDrawCall);

			setViewport(gl, viewport);
			gl.patchParameteri(GL_PATCH_VERTICES, 6);

			for (int outerEdgeIndex = 0; outerEdgeIndex < (int)edgeDescriptions.size(); outerEdgeIndex++)
			{
				const OuterEdgeDescription& edgeDesc = edgeDescriptions[outerEdgeIndex];

				for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(singleOuterEdgeLevels); outerEdgeLevelCaseNdx++)
				{
					typedef std::set<Vec3, VecLexLessThan<3> > Vec3Set;

					const vector<float>				patchTessLevels		= generatePatchTessLevels(1, outerEdgeIndex, singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);
					const glu::VertexArrayBinding	bindings[]			= { glu::va::Float("in_v_attr", 1, (int)patchTessLevels.size(), 0, &patchTessLevels[0]) };

					log << TestLog::Message << "Testing with outer tessellation level " << singleOuterEdgeLevels[outerEdgeLevelCaseNdx]
											<< " for the " << edgeDesc.description() << " edge, and with various levels for other edges" << TestLog::EndMessage;

					{
						const deUint32 programGL = m_program->getProgram();

						gl.useProgram(programGL);

						{
							const TFHandler::Result		tfResult		= tfHandler.renderAndGetPrimitives(programGL, outputPrimitiveTypeGL(m_primitiveType, m_usePointMode),
																										   DE_LENGTH_OF_ARRAY(bindings), &bindings[0], (int)patchTessLevels.size());
							const int					refNumVertices	= referenceVertexCount(m_primitiveType, m_spacing, m_usePointMode, &patchTessLevels[0], &patchTessLevels[2]);

							if ((int)tfResult.varying.size() != refNumVertices)
							{
								log << TestLog::Message << "Failure: the number of vertices returned by transform feedback is "
														<< tfResult.varying.size() << ", expected " << refNumVertices << TestLog::EndMessage
									<< TestLog::Message << "Note: rendered 1 patch, tessellation levels are (in order [inner0, inner1, outer0, outer1, outer2, outer3]):\n"
														<< containerStr(patchTessLevels, 6) << TestLog::EndMessage;

								m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
								return STOP;
							}

							// Check the vertices.

							{
								Vec3Set nonMirroredEdgeVertices;
								Vec3Set mirroredEdgeVertices;

								// We're interested in just the vertices on the current outer edge.
								for(int vtxNdx = 0; vtxNdx < refNumVertices; vtxNdx++)
								{
									const Vec3& vtx = tfResult.varying[vtxNdx].swizzle(0,1,2);
									if (edgeDesc.contains(vtx))
									{
										// Ignore the middle vertex of the outer edge, as it's exactly at the mirroring point;
										// for isolines, also ignore (0, 0) and (1, 0) because there's no mirrored counterpart for them.
										if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES && vtx == tcu::select(Vec3(0.0f), Vec3(0.5f), singleTrueMask<3>(edgeDesc.constantCoordinateIndex)))
											continue;
										if (m_primitiveType == TESSPRIMITIVETYPE_QUADS && vtx.swizzle(0,1) == tcu::select(Vec2(edgeDesc.constantCoordinateValueChoices[0]),
																															   Vec2(0.5f),
																															   singleTrueMask<2>(edgeDesc.constantCoordinateIndex)))
											continue;
										if (m_primitiveType == TESSPRIMITIVETYPE_ISOLINES && (vtx == Vec3(0.0f, 0.5f, 0.0f) || vtx == Vec3(1.0f, 0.5f, 0.0f) ||
																							  vtx == Vec3(0.0f, 0.0f, 0.0f) || vtx == Vec3(1.0f, 0.0f, 0.0f)))
											continue;

										const bool isMirrored = tfResult.varying[vtxNdx].w() > 0.5f;
										if (isMirrored)
											mirroredEdgeVertices.insert(vtx);
										else
											nonMirroredEdgeVertices.insert(vtx);
									}
								}

								if (m_primitiveType != TESSPRIMITIVETYPE_ISOLINES)
								{
									// Check that both endpoints are present. Note that endpoints aren't mirrored by the shader, since they belong to more than one edge.

									Vec3 endpointA;
									Vec3 endpointB;

									if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
									{
										endpointA = tcu::select(Vec3(1.0f), Vec3(0.0f), singleTrueMask<3>((edgeDesc.constantCoordinateIndex + 1) % 3));
										endpointB = tcu::select(Vec3(1.0f), Vec3(0.0f), singleTrueMask<3>((edgeDesc.constantCoordinateIndex + 2) % 3));
									}
									else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
									{
										endpointA.xy() = tcu::select(Vec2(edgeDesc.constantCoordinateValueChoices[0]), Vec2(0.0f), singleTrueMask<2>(edgeDesc.constantCoordinateIndex));
										endpointB.xy() = tcu::select(Vec2(edgeDesc.constantCoordinateValueChoices[0]), Vec2(1.0f), singleTrueMask<2>(edgeDesc.constantCoordinateIndex));
									}
									else
										DE_ASSERT(false);

									if (!contains(nonMirroredEdgeVertices, endpointA) ||
										!contains(nonMirroredEdgeVertices, endpointB))
									{
										log << TestLog::Message << "Failure: edge doesn't contain both endpoints, " << endpointA << " and " << endpointB << TestLog::EndMessage
											<< TestLog::Message << "Note: non-mirrored vertices:\n" << containerStr(nonMirroredEdgeVertices, 5)
																<< "\nmirrored vertices:\n" << containerStr(mirroredEdgeVertices, 5) << TestLog::EndMessage;
										m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
										return STOP;
									}
									nonMirroredEdgeVertices.erase(endpointA);
									nonMirroredEdgeVertices.erase(endpointB);
								}

								if (nonMirroredEdgeVertices != mirroredEdgeVertices)
								{
									log << TestLog::Message << "Failure: the set of mirrored edges isn't equal to the set of non-mirrored edges (ignoring endpoints and possible middle)" << TestLog::EndMessage
										<< TestLog::Message << "Note: non-mirrored vertices:\n" << containerStr(nonMirroredEdgeVertices, 5)
																<< "\nmirrored vertices:\n" << containerStr(mirroredEdgeVertices, 5) << TestLog::EndMessage;
									m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid set of vertices");
									return STOP;
								}
							}
						}
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}